

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::UnaryExpr<const_entityx::ComponentHandle<Position,_entityx::EntityManager>_&>::UnaryExpr
          (UnaryExpr<const_entityx::ComponentHandle<Position,_entityx::EntityManager>_&> *this,
          ComponentHandle<Position,_entityx::EntityManager> *lhs)

{
  EntityManager *this_00;
  Id id;
  bool bVar1;
  
  this_00 = lhs->manager_;
  if (this_00 != (EntityManager *)0x0) {
    id.id_ = (lhs->id_).id_;
    if (((id.id_ & 0xffffffff) < (ulong)(*(long *)(this_00 + 0x68) - *(long *)(this_00 + 0x60) >> 2)
        ) && (*(int *)(*(long *)(this_00 + 0x60) + (id.id_ & 0xffffffff) * 4) ==
              (int)(id.id_ >> 0x20))) {
      bVar1 = entityx::EntityManager::has_component<Position>(this_00,id);
      goto LAB_001a4787;
    }
  }
  bVar1 = false;
LAB_001a4787:
  (this->super_ITransientExpression).m_isBinaryExpression = false;
  (this->super_ITransientExpression).m_result = bVar1;
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001f3bf8;
  this->m_lhs = lhs;
  return;
}

Assistant:

explicit UnaryExpr( LhsT lhs )
        :   ITransientExpression{ false, static_cast<bool>(lhs) },
            m_lhs( lhs )
        {}